

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_impl.cpp
# Opt level: O0

UChar32 utf8_nextCharSafeBody_63(uint8_t *s,int32_t *pi,int32_t length,UChar32 c,UBool strict)

{
  uint8_t uVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  UChar32 UVar6;
  long lVar7;
  long lVar8;
  uint8_t t1_3;
  uint8_t t2_2;
  uint8_t t1_2;
  uint8_t t2_1;
  uint8_t t1_1;
  uint8_t t3;
  uint8_t t2;
  uint8_t t1;
  int32_t i;
  UBool strict_local;
  UChar32 c_local;
  int32_t length_local;
  int32_t *pi_local;
  uint8_t *s_local;
  
  iVar2 = *pi;
  _t1_3 = iVar2;
  if ((iVar2 != length) && (c < 0xf5)) {
    if (c < 0xf0) {
      if (c < 0xe0) {
        if ((0xc1 < c) && (uVar1 = s[iVar2], (byte)(uVar1 + 0x80) < 0x40)) {
          *pi = iVar2 + 1;
          return (c + -0xc0) * 0x40 | (uint)(byte)(uVar1 + 0x80);
        }
      }
      else {
        uVar4 = c & 0xf;
        if (strict == -2) {
          bVar3 = s[iVar2] + 0x80;
          if ((bVar3 < 0x40) &&
             ((((uVar4 != 0 || (0x1f < bVar3)) && (_t1_3 = iVar2 + 1, _t1_3 != length)) &&
              (uVar1 = s[_t1_3], (byte)(uVar1 + 0x80) < 0x40)))) {
            *pi = iVar2 + 2;
            return uVar4 << 0xc | (uint)bVar3 << 6 | (uint)(byte)(uVar1 + 0x80);
          }
        }
        else if (((((int)" 000000000000\x1000"[(int)uVar4] & 1 << (sbyte)((int)(uint)s[iVar2] >> 5))
                   != 0) && (_t1_3 = iVar2 + 1, _t1_3 != length)) &&
                (bVar3 = s[_t1_3] + 0x80, bVar3 < 0x40)) {
          uVar4 = uVar4 << 0xc | (s[iVar2] & 0x3f) << 6;
          uVar5 = uVar4 | bVar3;
          if (((strict < '\x01') || (uVar5 < 0xfdd0)) ||
             (((0xfdef < uVar5 && ((uVar4 | bVar3 & 0xfffe) != 0xfffe)) ||
              (_t1_3 = iVar2 + 2, 0x10ffff < uVar5)))) {
            *pi = iVar2 + 2;
            return uVar5;
          }
        }
      }
    }
    else if ((((((int)""[(int)(uint)s[iVar2] >> 4] & 1 << (sbyte)(c & 7U)) != 0) &&
              (_t1_3 = iVar2 + 1, _t1_3 != length)) &&
             (lVar7 = (long)_t1_3, (byte)(s[lVar7] + 0x80) < 0x40)) &&
            ((_t1_3 = iVar2 + 2, _t1_3 != length &&
             (lVar8 = (long)_t1_3, (byte)(s[lVar8] + 0x80) < 0x40)))) {
      _t1_3 = iVar2 + 3;
      uVar4 = (c & 7U) << 0x12 | (s[iVar2] & 0x3f) << 0xc | (uint)(byte)(s[lVar7] + 0x80) << 6 |
              (uint)(byte)(s[lVar8] + 0x80);
      if (((strict < '\x01') || (uVar4 < 0xfdd0)) ||
         (((0xfdef < uVar4 && ((uVar4 & 0xfffe) != 0xfffe)) || (0x10ffff < uVar4)))) {
        *pi = _t1_3;
        return uVar4;
      }
    }
  }
  UVar6 = errorValue(_t1_3 - *pi,strict);
  *pi = _t1_3;
  return UVar6;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utf8_nextCharSafeBody(const uint8_t *s, int32_t *pi, int32_t length, UChar32 c, UBool strict) {
    // *pi is one after byte c.
    int32_t i=*pi;
    // length can be negative for NUL-terminated strings: Read and validate one byte at a time.
    if(i==length || c>0xf4) {
        // end of string, or not a lead byte
    } else if(c>=0xf0) {
        // Test for 4-byte sequences first because
        // U8_NEXT() handles shorter valid sequences inline.
        uint8_t t1=s[i], t2, t3;
        c&=7;
        if(U8_IS_VALID_LEAD4_AND_T1(c, t1) &&
                ++i!=length && (t2=s[i]-0x80)<=0x3f &&
                ++i!=length && (t3=s[i]-0x80)<=0x3f) {
            ++i;
            c=(c<<18)|((t1&0x3f)<<12)|(t2<<6)|t3;
            // strict: forbid non-characters like U+fffe
            if(strict<=0 || !U_IS_UNICODE_NONCHAR(c)) {
                *pi=i;
                return c;
            }
        }
    } else if(c>=0xe0) {
        c&=0xf;
        if(strict!=-2) {
            uint8_t t1=s[i], t2;
            if(U8_IS_VALID_LEAD3_AND_T1(c, t1) &&
                    ++i!=length && (t2=s[i]-0x80)<=0x3f) {
                ++i;
                c=(c<<12)|((t1&0x3f)<<6)|t2;
                // strict: forbid non-characters like U+fffe
                if(strict<=0 || !U_IS_UNICODE_NONCHAR(c)) {
                    *pi=i;
                    return c;
                }
            }
        } else {
            // strict=-2 -> lenient: allow surrogates
            uint8_t t1=s[i]-0x80, t2;
            if(t1<=0x3f && (c>0 || t1>=0x20) &&
                    ++i!=length && (t2=s[i]-0x80)<=0x3f) {
                *pi=i+1;
                return (c<<12)|(t1<<6)|t2;
            }
        }
    } else if(c>=0xc2) {
        uint8_t t1=s[i]-0x80;
        if(t1<=0x3f) {
            *pi=i+1;
            return ((c-0xc0)<<6)|t1;
        }
    }  // else 0x80<=c<0xc2 is not a lead byte

    /* error handling */
    c=errorValue(i-*pi, strict);
    *pi=i;
    return c;
}